

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

unique_color __thiscall
crnlib::dxt1_endpoint_optimizer::lerp_color
          (dxt1_endpoint_optimizer *this,color_quad_u8 *a,color_quad_u8 *b,float f,int rounding)

{
  color_quad<unsigned_char,_int> *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  undefined4 in_register_0000000c;
  float in_R8D;
  float fVar5;
  float local_3c;
  color_quad<unsigned_char,_int> local_34;
  float r;
  color_quad_u8 res;
  int rounding_local;
  float f_local;
  color_quad_u8 *b_local;
  color_quad_u8 *a_local;
  dxt1_endpoint_optimizer *this_local;
  
  this_00 = (color_quad<unsigned_char,_int> *)CONCAT44(in_register_0000000c,rounding);
  r = in_R8D;
  res.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)f;
  color_quad<unsigned_char,_int>::color_quad(&local_34);
  local_3c = 1.0;
  if (r == 0.0) {
    local_3c = 0.0;
  }
  bVar1 = color_quad<unsigned_char,_int>::operator[](b,0);
  bVar2 = color_quad<unsigned_char,_int>::operator[](this_00,0);
  fVar5 = math::lerp<float,float>((float)bVar1,(float)bVar2,(float)res.field_0);
  iVar3 = math::float_to_int(local_3c + fVar5);
  iVar3 = math::clamp<int>(iVar3,0,0xff);
  puVar4 = color_quad<unsigned_char,_int>::operator[](&local_34,0);
  *puVar4 = (uchar)iVar3;
  bVar1 = color_quad<unsigned_char,_int>::operator[](b,1);
  bVar2 = color_quad<unsigned_char,_int>::operator[](this_00,1);
  fVar5 = math::lerp<float,float>((float)bVar1,(float)bVar2,(float)res.field_0);
  iVar3 = math::float_to_int(local_3c + fVar5);
  iVar3 = math::clamp<int>(iVar3,0,0xff);
  puVar4 = color_quad<unsigned_char,_int>::operator[](&local_34,1);
  *puVar4 = (uchar)iVar3;
  bVar1 = color_quad<unsigned_char,_int>::operator[](b,2);
  bVar2 = color_quad<unsigned_char,_int>::operator[](this_00,2);
  fVar5 = math::lerp<float,float>((float)bVar1,(float)bVar2,(float)res.field_0);
  iVar3 = math::float_to_int(local_3c + fVar5);
  iVar3 = math::clamp<int>(iVar3,0,0xff);
  puVar4 = color_quad<unsigned_char,_int>::operator[](&local_34,2);
  *puVar4 = (uchar)iVar3;
  puVar4 = color_quad<unsigned_char,_int>::operator[](&local_34,3);
  *puVar4 = 0xff;
  unique_color::unique_color((unique_color *)this,&local_34,1);
  return (unique_color)this;
}

Assistant:

unique_color dxt1_endpoint_optimizer::lerp_color(const color_quad_u8& a, const color_quad_u8& b, float f, int rounding)
    {
        color_quad_u8 res;

        float r = rounding ? 1.0f : 0.0f;
        res[0] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[0], b[0], f)), 0, 255));
        res[1] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[1], b[1], f)), 0, 255));
        res[2] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[2], b[2], f)), 0, 255));
        res[3] = 255;

        return unique_color(res, 1);
    }